

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerReichMooreBlockBase::verifySize
               (int NPL,int MPAR,int NRB)

{
  undefined8 *puVar1;
  char *args;
  
  if (NPL < 1) {
    tools::Log::error<char_const*>("Encountered empty list");
    tools::Log::info<char_const*>("NPL should be larger than zero and equal to 6 * NRB");
    args = "NPL value: {}";
    MPAR = NPL;
  }
  else {
    if (MPAR - 6U < 0xfffffffb) {
      tools::Log::error<char_const*>("Encountered illegal MPAR value");
      tools::Log::info<char_const*>("NRB should be a value between 1 and 5");
      goto LAB_00177920;
    }
    if (NRB < 1) {
      tools::Log::error<char_const*>("Encountered illegal NRB value");
      tools::Log::info<char_const*>("NRB should be larger than zero");
      MPAR = NRB;
      goto LAB_00177920;
    }
    if (((uint)((NRB * MPAR + 1) * NRB * MPAR) >> 1) + NRB * 6 == NPL) {
      return;
    }
    tools::Log::error<char_const*>("Encountered inconsistent list size");
    tools::Log::info<char_const*>
              ("NPL must be equal to 6 * NRB + MPAR * NRB * ( MPAR * NRB + 1 ) / 2");
    tools::Log::info<char_const*,int>("NPL value: {}",NPL);
    args = "MPAR value: {}";
  }
  tools::Log::info<char_const*,int>(args,MPAR);
  MPAR = NRB;
LAB_00177920:
  tools::Log::info<char_const*,int>("NRB value: {}",MPAR);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int MPAR, int NRB ) {

  if ( NPL < 1 ) {

    Log::error( "Encountered empty list" );
    Log::info( "NPL should be larger than zero and equal to 6 * NRB" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NRB value: {}", NRB );
    throw std::exception();
  }

  if ( ( MPAR < 1 ) || ( MPAR > 5 ) ) {

    Log::error( "Encountered illegal MPAR value" );
    Log::info( "NRB should be a value between 1 and 5" );
    Log::info( "NRB value: {}", MPAR );
    throw std::exception();
  }

  if ( NRB < 1 ) {

    Log::error( "Encountered illegal NRB value" );
    Log::info( "NRB should be larger than zero" );
    Log::info( "NRB value: {}", NRB );
    throw std::exception();
  }

  if ( NPL != 6 * NRB + MPAR * NRB * ( MPAR * NRB + 1 ) / 2 ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to 6 * NRB + MPAR * NRB * ( MPAR * NRB + 1 ) / 2" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "MPAR value: {}", MPAR );
    Log::info( "NRB value: {}", NRB );
    throw std::exception();
  }
}